

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playmidi.cpp
# Opt level: O2

void __thiscall Timidity::Renderer::recompute_amp(Renderer *this,Voice *v)

{
  ulong uVar1;
  Sample *pSVar10;
  undefined1 auVar11 [15];
  undefined1 auVar12 [14];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  unkuint9 Var20;
  undefined1 auVar21 [11];
  undefined1 auVar22 [13];
  undefined1 auVar23 [14];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  Channel *pCVar26;
  float fVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  undefined1 auVar31 [16];
  double dStack_20;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined6 uVar4;
  undefined1 uVar5;
  undefined5 uVar6;
  undefined2 uVar7;
  undefined4 uVar8;
  undefined2 uVar9;
  
  pCVar26 = this->channel + v->channel;
  uVar1._0_1_ = pCVar26->volume;
  uVar2 = pCVar26->expression;
  uVar3 = pCVar26->panning;
  uVar5 = pCVar26->field_0x1b;
  uVar7 = pCVar26->rpn;
  uVar9 = pCVar26->nrpn;
  uVar8 = CONCAT22(uVar9,uVar7);
  uVar6 = CONCAT41(uVar8,uVar5);
  uVar4 = CONCAT51(uVar6,uVar3);
  uVar1._1_7_ = CONCAT61(uVar4,uVar2);
  pSVar10 = v->sample;
  if (pSVar10->type == '\0') {
    fVar27 = (float)((uint)(byte)vol_table[v->velocity] *
                    (uint)(byte)vol_table[(ushort)((((uint)uVar1 & 0xff) *
                                                   ((uint)uVar1._1_7_ & 0xff)) / 0x7f)]) *
             1.53787e-05;
  }
  else {
    dVar28 = log10(127.0 / (double)v->velocity);
    auVar11._8_6_ = 0;
    auVar11._0_8_ = uVar1;
    auVar11[0xe] = (char)((ushort)uVar9 >> 8);
    auVar13._8_4_ = 0;
    auVar13._0_8_ = uVar1;
    auVar13[0xc] = (char)uVar9;
    auVar13._13_2_ = auVar11._13_2_;
    auVar14._8_4_ = 0;
    auVar14._0_8_ = uVar1;
    auVar14._12_3_ = auVar13._12_3_;
    auVar15._8_2_ = 0;
    auVar15._0_8_ = uVar1;
    auVar15[10] = (char)((ushort)uVar7 >> 8);
    auVar15._11_4_ = auVar14._11_4_;
    auVar16._8_2_ = 0;
    auVar16._0_8_ = uVar1;
    auVar16._10_5_ = auVar15._10_5_;
    auVar17[8] = (char)uVar7;
    auVar17._0_8_ = uVar1;
    auVar17._9_6_ = auVar16._9_6_;
    auVar19._7_8_ = 0;
    auVar19._0_7_ = auVar17._8_7_;
    Var20 = CONCAT81(SUB158(auVar19 << 0x40,7),uVar5);
    auVar24._9_6_ = 0;
    auVar24._0_9_ = Var20;
    auVar21._1_10_ = SUB1510(auVar24 << 0x30,5);
    auVar21[0] = uVar3;
    auVar25._11_4_ = 0;
    auVar25._0_11_ = auVar21;
    auVar22._1_12_ = SUB1512(auVar25 << 0x20,3);
    auVar22[0] = uVar2;
    auVar18._2_13_ = auVar22;
    auVar18._0_2_ = CONCAT11(0,(undefined1)uVar1);
    auVar12._10_2_ = 0;
    auVar12._0_10_ = auVar18._0_10_;
    auVar12._12_2_ = (short)Var20;
    auVar23._2_4_ = auVar12._10_4_;
    auVar23._0_2_ = auVar21._0_2_;
    auVar23._6_8_ = 0;
    auVar31._0_8_ = (double)CONCAT11(0,(undefined1)uVar1);
    auVar31._8_8_ = (double)(int)CONCAT82(SUB148(auVar23 << 0x40,6),auVar22._0_2_);
    auVar31 = divpd(_DAT_00670e20,auVar31);
    dVar29 = log10(auVar31._0_8_);
    dStack_20 = auVar31._8_8_;
    dVar30 = log10(dStack_20);
    fVar27 = (float)((dVar30 + dVar29 + dVar28) * 400.0) + pSVar10->initial_attenuation;
  }
  v->attenuation = fVar27;
  return;
}

Assistant:

void Renderer::recompute_amp(Voice *v)
{
	Channel *chan = &channel[v->channel];
	int chanvol = chan->volume;
	int chanexpr = chan->expression;

	if (v->sample->type == INST_GUS)
	{
		v->attenuation = (vol_table[(chanvol * chanexpr) / 127] * vol_table[v->velocity]) * ((127 + 64) / 12419775.f);
	}
	else
	{
		// Implicit modulators from SF2 spec
		double velatten, cc7atten, cc11atten;

		velatten = log10(127.0 / v->velocity);
		cc7atten = log10(127.0 / chanvol);
		cc11atten = log10(127.0 / chanexpr);
		v->attenuation = float(400 * (velatten + cc7atten + cc11atten)) + v->sample->initial_attenuation;
	}
}